

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httprpc.cpp
# Opt level: O0

void StopHTTPRPC(void)

{
  bool bVar1;
  uint uVar2;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  undefined1 in_stack_00000010 [16];
  Level in_stack_000000f0;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  LogFlags in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffdf;
  ConstevalFormatString<0U> fmt;
  
  fmt.fmt = *(char **)(in_FS_OFFSET + 0x28);
  bVar1 = LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff88 = "Stopping HTTP RPC server\n";
    in_stack_ffffffffffffff48 = 1;
    LogPrintFormatInternal<>
              ((string_view)in_stack_00000010,in_stack_00000000,in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb0,in_stack_000000f0,fmt);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (allocator<char> *)in_stack_ffffffffffffff88);
  UnregisterHTTPHandler(in_stack_ffffffffffffff98,(bool)in_stack_ffffffffffffffdf);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  uVar2 = (**g_wallet_init_interface->_vptr_WalletInitInterface)();
  if ((uVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               (allocator<char> *)in_stack_ffffffffffffff88);
    UnregisterHTTPHandler(in_stack_ffffffffffffff98,(bool)in_stack_ffffffffffffffdf);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff96);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>
                      *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (bVar1) {
    std::unique_ptr<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>::get
              ((unique_ptr<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    RPCUnsetTimerInterface
              ((RPCTimerInterface *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    std::unique_ptr<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>::reset
              ((unique_ptr<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),(pointer)0x150f7e3);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) != fmt.fmt) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void StopHTTPRPC()
{
    LogDebug(BCLog::RPC, "Stopping HTTP RPC server\n");
    UnregisterHTTPHandler("/", true);
    if (g_wallet_init_interface.HasWalletSupport()) {
        UnregisterHTTPHandler("/wallet/", false);
    }
    if (httpRPCTimerInterface) {
        RPCUnsetTimerInterface(httpRPCTimerInterface.get());
        httpRPCTimerInterface.reset();
    }
}